

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::createLoopMerge
          (Builder *this,Block *mergeBlock,Block *continueBlock,uint control,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands)

{
  int iVar1;
  Id IVar2;
  Instruction *pIVar3;
  size_type sVar4;
  const_reference pvVar5;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48;
  int local_3c;
  Instruction *pIStack_38;
  int op;
  Instruction *merge;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *operands_local;
  Block *pBStack_20;
  uint control_local;
  Block *continueBlock_local;
  Block *mergeBlock_local;
  Builder *this_local;
  
  merge = (Instruction *)operands;
  operands_local._4_4_ = control;
  pBStack_20 = continueBlock;
  continueBlock_local = mergeBlock;
  mergeBlock_local = (Block *)this;
  pIVar3 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(pIVar3,OpLoopMerge);
  pIStack_38 = pIVar3;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)merge);
  spv::Instruction::reserveOperands(pIVar3,sVar4 + 3);
  pIVar3 = pIStack_38;
  IVar2 = Block::getId(continueBlock_local);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = pIStack_38;
  IVar2 = Block::getId(pBStack_20);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  spv::Instruction::addImmediateOperand(pIStack_38,operands_local._4_4_);
  local_3c = 0;
  while( true ) {
    iVar1 = local_3c;
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)merge);
    pIVar3 = pIStack_38;
    if ((int)sVar4 <= iVar1) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)merge,(long)local_3c)
    ;
    spv::Instruction::addImmediateOperand(pIVar3,*pvVar5);
    local_3c = local_3c + 1;
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_48,
             pIStack_38);
  addInstruction(this,&local_48);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_48);
  return;
}

Assistant:

void Builder::createLoopMerge(Block* mergeBlock, Block* continueBlock, unsigned int control,
                              const std::vector<unsigned int>& operands)
{
    Instruction* merge = new Instruction(OpLoopMerge);
    merge->reserveOperands(operands.size() + 3);
    merge->addIdOperand(mergeBlock->getId());
    merge->addIdOperand(continueBlock->getId());
    merge->addImmediateOperand(control);
    for (int op = 0; op < (int)operands.size(); ++op)
        merge->addImmediateOperand(operands[op]);
    addInstruction(std::unique_ptr<Instruction>(merge));
}